

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

_Bool sysbvm_string_equals(sysbvm_tuple_t a,sysbvm_tuple_t b)

{
  _Bool _Var1;
  int iVar2;
  size_t __n;
  size_t sVar3;
  uint8_t *secondBytes;
  uint8_t *firstBytes;
  size_t secondSize;
  size_t firstSize;
  sysbvm_tuple_t b_local;
  sysbvm_tuple_t a_local;
  
  if (a == b) {
    a_local._7_1_ = true;
  }
  else {
    _Var1 = sysbvm_tuple_isNonNullPointer(a);
    if ((_Var1) && (_Var1 = sysbvm_tuple_isNonNullPointer(b), _Var1)) {
      __n = sysbvm_tuple_getSizeInBytes(a);
      sVar3 = sysbvm_tuple_getSizeInBytes(b);
      if (__n == sVar3) {
        iVar2 = memcmp((void *)(a + 0x10),(void *)(b + 0x10),__n);
        a_local._7_1_ = iVar2 == 0;
      }
      else {
        a_local._7_1_ = false;
      }
    }
    else {
      a_local._7_1_ = false;
    }
  }
  return a_local._7_1_;
}

Assistant:

SYSBVM_API bool sysbvm_string_equals(sysbvm_tuple_t a, sysbvm_tuple_t b)
{
    if(a == b)
        return true;

    if(!sysbvm_tuple_isNonNullPointer(a) || !sysbvm_tuple_isNonNullPointer(b))
        return false;

    size_t firstSize = sysbvm_tuple_getSizeInBytes(a);
    size_t secondSize = sysbvm_tuple_getSizeInBytes(b);
    if(firstSize != secondSize)
        return false;

    uint8_t *firstBytes = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(a)->bytes;
    uint8_t *secondBytes = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(b)->bytes;
    return memcmp(firstBytes, secondBytes, firstSize) == 0;
}